

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdGetPsbtUtxoData(void *handle,void *psbt_handle,char *txid,uint32_t vout,int64_t *amount,
                      char **locking_script,char **redeem_script,char **descriptor,
                      char **full_tx_hex)

{
  bool bVar1;
  uint32_t index;
  int iVar2;
  CfdException *pCVar3;
  allocator local_99;
  OutPoint outpoint;
  Txid local_70;
  string local_50;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&outpoint,"PsbtHandle",(allocator *)&local_70);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&outpoint);
  std::__cxx11::string::~string((string *)&outpoint);
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    outpoint.txid_._vptr_Txid = (_func_int **)0x4fd756;
    outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x470;
    outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdGetPsbtUtxoData";
    cfd::core::logger::warn<>((CfdSourceLocation *)&outpoint,"txid is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&outpoint,"Failed to parameter. txid is null or empty.",
               (allocator *)&local_70);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&outpoint);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) != 0) {
    std::__cxx11::string::string((string *)&local_50,txid,&local_99);
    cfd::core::Txid::Txid(&local_70,&local_50);
    cfd::core::OutPoint::OutPoint(&outpoint,&local_70,vout);
    cfd::core::Txid::~Txid(&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    index = cfd::Psbt::GetTxInIndex(*(Psbt **)((long)psbt_handle + 0x18),&outpoint);
    iVar2 = CfdGetPsbtUtxoDataByIndex
                      (handle,psbt_handle,index,(char **)0x0,(uint32_t *)0x0,amount,locking_script,
                       redeem_script,descriptor,full_tx_hex);
    cfd::core::Txid::~Txid(&outpoint.txid_);
    return iVar2;
  }
  outpoint.txid_._vptr_Txid = (_func_int **)0x4fd756;
  outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x476;
  outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CfdGetPsbtUtxoData";
  cfd::core::logger::warn<>((CfdSourceLocation *)&outpoint,"psbt is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&outpoint,"Failed to handle statement. psbt is null.",(allocator *)&local_70)
  ;
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&outpoint);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtUtxoData(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout,
    int64_t* amount, char** locking_script, char** redeem_script,
    char** descriptor, char** full_tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    OutPoint outpoint(Txid(txid), vout);
    uint32_t index = psbt_obj->psbt->GetTxInIndex(outpoint);

    return CfdGetPsbtUtxoDataByIndex(
        handle, psbt_handle, index, nullptr, nullptr, amount, locking_script,
        redeem_script, descriptor, full_tx_hex);
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}